

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# occurrencetocsv.cpp
# Opt level: O1

void occ_doit<occurrence_granular>(occurrence_granular *q)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  int occ_day;
  int occ_month;
  int occ_year;
  
  sVar2 = fread(q,0x10,1,_stdin);
  if ((int)sVar2 != 0) {
    do {
      iVar4 = granular_date_;
      lVar1 = q->occ_date_id;
      lVar3 = 0x5a0;
      if (granular_date_ == 0) {
        lVar3 = 1;
      }
      d((long)(int)(lVar1 / lVar3),&occ_year,&occ_month,&occ_day);
      if (iVar4 == 0) {
        printf("%d,%d,%d,%d,%d\n",(ulong)(uint)q->event_id,(ulong)(uint)q->period_no,
               (ulong)(uint)occ_year,(ulong)(uint)occ_month,(ulong)(uint)occ_day);
      }
      else {
        iVar4 = (int)lVar1 + (int)(lVar1 / 0x5a0) * -0x5a0;
        printf("%d,%d,%d,%d,%d,%d,%d\n",(ulong)(uint)q->event_id,(ulong)(uint)q->period_no,
               (ulong)(uint)occ_year,(ulong)(uint)occ_month,(ulong)(uint)occ_day,
               (ulong)(uint)(iVar4 / 0x3c),(ulong)(uint)(iVar4 % 0x3c));
      }
      sVar2 = fread(q,0x10,1,_stdin);
    } while ((int)sVar2 != 0);
  }
  return;
}

Assistant:

void occ_doit(T &q)
{

	int occ_year, occ_month, occ_day;
	int occ_hour = 0;
	int occ_minute = 0;
	int i = fread(&q, sizeof(q), 1, stdin);
	while (i != 0) {
		int days = q.occ_date_id / (1440 - 1439 * !granular_date_);
		d(days, occ_year, occ_month, occ_day);
		if (granular_date_) {
			int minutes = q.occ_date_id % 1440;
			occ_hour = minutes / 60;
			occ_minute = minutes % 60;
			printf("%d,%d,%d,%d,%d,%d,%d\n", q.event_id,
			       q.period_no, occ_year, occ_month, occ_day,
			       occ_hour, occ_minute);
		} else {
			printf("%d,%d,%d,%d,%d\n",  q.event_id, q.period_no,
			       occ_year, occ_month, occ_day);
		}
		i = fread(&q, sizeof(q), 1, stdin);
	}

}